

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QDBusPlatformMenuItem_*>_>::findBucketWithHash<int>
          (Data<QHashPrivate::Node<int,_QDBusPlatformMenuItem_*>_> *this,int *key,size_t hash)

{
  Span *pSVar1;
  Span *pSVar2;
  ulong uVar3;
  byte bVar4;
  Bucket BVar5;
  
  pSVar1 = this->spans;
  uVar3 = this->numBuckets - 1 & hash;
  pSVar2 = pSVar1 + (uVar3 >> 7);
  uVar3 = (ulong)((uint)uVar3 & 0x7f);
  bVar4 = pSVar2->offsets[uVar3];
  if (bVar4 != 0xff) {
    do {
      if (*(int *)pSVar2->entries[bVar4].storage.data == *key) break;
      uVar3 = uVar3 + 1;
      if (uVar3 == 0x80) {
        pSVar2 = pSVar2 + 1;
        if (((long)pSVar2 - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) == 0)
        {
          pSVar2 = pSVar1;
        }
        uVar3 = 0;
      }
      bVar4 = pSVar2->offsets[uVar3];
    } while (bVar4 != 0xff);
  }
  BVar5.index = uVar3;
  BVar5.span = pSVar2;
  return BVar5;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }